

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EulerAngles.cpp
# Opt level: O3

EulerAngles * __thiscall
KDIS::DATA_TYPE::EulerAngles::operator-(EulerAngles *this,EulerAngles *Value)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  KFLOAT32 KVar5;
  EulerAngles *tmp;
  EulerAngles *in_RDI;
  
  (in_RDI->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__EulerAngles_00310860;
  in_RDI->m_f32Phi = this->m_f32Phi;
  KVar5 = this->m_f32Theta;
  in_RDI->m_f32Psi = this->m_f32Psi;
  in_RDI->m_f32Theta = KVar5;
  uVar1 = Value->m_f32Psi;
  uVar3 = Value->m_f32Theta;
  uVar2 = in_RDI->m_f32Psi;
  uVar4 = in_RDI->m_f32Theta;
  in_RDI->m_f32Psi = (KFLOAT32)((float)uVar2 - (float)uVar1);
  in_RDI->m_f32Theta = (KFLOAT32)((float)uVar4 - (float)uVar3);
  in_RDI->m_f32Phi = (KFLOAT32)((float)in_RDI->m_f32Phi - (float)Value->m_f32Phi);
  return in_RDI;
}

Assistant:

EulerAngles EulerAngles::operator - ( const EulerAngles & Value ) const
{
    EulerAngles tmp = *this;
    tmp.m_f32Psi   -= Value.m_f32Psi;
    tmp.m_f32Theta -= Value.m_f32Theta;
    tmp.m_f32Phi   -= Value.m_f32Phi;
    return tmp;
}